

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O3

void __thiscall testing::Matcher<mp::CallExpr>::Matcher(Matcher<mp::CallExpr> *this,CallExpr value)

{
  linked_ptr<const_testing::MatcherInterface<mp::CallExpr>_> local_30;
  
  (this->super_MatcherBase<mp::CallExpr>).impl_.value_ = (MatcherInterface<mp::CallExpr> *)0x0;
  (this->super_MatcherBase<mp::CallExpr>).impl_.link_.next_ =
       &(this->super_MatcherBase<mp::CallExpr>).impl_.link_;
  (this->super_MatcherBase<mp::CallExpr>)._vptr_MatcherBase =
       (_func_int **)&PTR__MatcherBase_001e1b10;
  local_30.value_ = (MatcherInterface<mp::CallExpr> *)operator_new(0x10);
  ((local_30.value_)->super_MatcherDescriberInterface)._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherDescriberInterface_001e51b0;
  local_30.value_[1].super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       (_func_int **)
       value.super_BasicExpr<(mp::expr::Kind)41,_(mp::expr::Kind)41>.super_ExprBase.impl_;
  local_30.link_.next_ = &local_30.link_;
  internal::linked_ptr<const_testing::MatcherInterface<mp::CallExpr>_>::operator=
            (&(this->super_MatcherBase<mp::CallExpr>).impl_,&local_30);
  internal::linked_ptr<const_testing::MatcherInterface<mp::CallExpr>_>::~linked_ptr(&local_30);
  return;
}

Assistant:

Matcher<T>::Matcher(T value) { *this = Eq(value); }